

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O1

string * __thiscall
stackjit::(anonymous_namespace)::loadString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryData *data,size_t *index
          )

{
  unsigned_long uVar1;
  
  uVar1 = anon_unknown_4::loadData<unsigned_long>((BinaryData *)this,(size_t *)data);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  while( true ) {
    if (uVar1 == 0) {
      return __return_storage_ptr__;
    }
    if ((pointer)(*(long *)(this + 8) - *(long *)this) <=
        (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
         = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start + 1;
    uVar1 = uVar1 - 1;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

std::string loadString(BinaryData& data, std::size_t& index) {
			auto size = loadData<std::size_t>(data, index);
			std::string str;
			str.reserve(size);

			for (std::size_t i = 0; i < size; i++, index++) {
				str.push_back(data.at(index));
			}

			return str;
		}